

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

ushort __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::BuildFreeBitVector
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,SmallHeapBlockBitVector *free)

{
  SmallHeapBlockBitVector *this_00;
  code *pcVar1;
  anon_class_24_3_be079e9c fn;
  undefined4 *puVar2;
  bool bVar3;
  BOOLEAN BVar4;
  ushort uVar5;
  BVIndex BVar6;
  FreeObject *this_01;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_02;
  ushort uVar7;
  SmallHeapBlockBitVector *local_58;
  SmallHeapBlockBitVector *free_local;
  undefined4 *local_48;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *local_40;
  ushort local_32;
  
  free->data[2].word = 0;
  free->data[3].word = 0;
  free->data[0].word = 0;
  free->data[1].word = 0;
  this_01 = this->freeObjectList;
  local_58 = free;
  free_local = free;
  local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  this_00 = &this->debugFreeBits;
  uVar7 = 0;
  local_40 = this;
  for (; this_01 != (FreeObject *)0x0; this_01 = FreeObject::GetNext(this_01)) {
    uVar5 = GetAddressBitIndex(this_01);
    bVar3 = IsValidBitIndex(this,(uint)uVar5);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = local_48;
      *local_48 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x766,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
      if (!bVar3) goto LAB_00622269;
      *puVar2 = 0;
      this = local_40;
    }
    BVar4 = BVStatic<256UL>::Test(this_00,(uint)uVar5);
    if (BVar4 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = local_48;
      *local_48 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x767,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                         "this->GetDebugFreeBitVector()->Test(bitIndex)");
      if (!bVar3) goto LAB_00622269;
      *puVar2 = 0;
      this = local_40;
    }
    BVStatic<256UL>::Set(free_local,(uint)uVar5);
    uVar7 = uVar7 + 1;
  }
  local_32 = uVar7;
  BVar6 = BVStatic<256UL>::Count(this_00);
  puVar2 = local_48;
  if (BVar6 != uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar2 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x76c,"(this->GetDebugFreeBitVector()->Count() == freeCount)",
                       "this->GetDebugFreeBitVector()->Count() == freeCount");
    if (!bVar3) goto LAB_00622269;
    *puVar2 = 0;
  }
  bVar3 = HeapBlock::IsAnyFinalizableBlock(&this->super_HeapBlock);
  if (bVar3) {
    this_02 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>(&this->super_HeapBlock);
    fn.free = &local_58;
    fn.this = this;
    fn.freeCount = &local_32;
    SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::BuildFreeBitVector(BVStatic<256ul>*)::_lambda(unsigned_int)_1_>
              (this_02,fn);
    uVar5 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
            AddDisposedObjectFreeBitVector(this_02,local_58);
    uVar7 = uVar5 + local_32;
    this = local_40;
    local_32 = uVar7;
  }
  if (this->lastFreeCount < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar2 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x77f,"(freeCount <= this->lastFreeCount)",
                       "freeCount <= this->lastFreeCount");
    if (!bVar3) {
LAB_00622269:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar2 = 0;
    uVar7 = local_32;
  }
  return uVar7;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::BuildFreeBitVector(SmallHeapBlockBitVector * free)
{
    free->ClearAll();
    ushort freeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        free->Set(bitIndex);
        freeCount++;
        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == freeCount);

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            free->Set(bitIndex);
            freeCount++;
        });

        // Include disposed objects
        freeCount += finalizableBlock->AddDisposedObjectFreeBitVector(free);
    }

    Assert(freeCount <= this->lastFreeCount);
    return freeCount;
}